

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  byte *pbVar1;
  sqlite3 *db;
  int iVar2;
  Expr *pEVar3;
  Expr *p;
  Expr ifNullRow;
  
  if (pExpr == (Expr *)0x0) {
    pExpr = (Expr *)0x0;
  }
  else {
    if (((pExpr->flags & 1) != 0) && (pSubst->iTable == (int)pExpr->iRightJoinTable)) {
      pExpr->iRightJoinTable = (i16)pSubst->iNewTable;
    }
    if (pExpr->op == 0xab) {
      if (pExpr->iTable == pSubst->iTable) {
        pExpr->iTable = pSubst->iNewTable;
      }
    }
    else if ((pExpr->op == 0xa2) && (pExpr->iTable == pSubst->iTable)) {
      if ((long)pExpr->iColumn < 0) {
        pExpr->op = 'r';
        return pExpr;
      }
      pEVar3 = pSubst->pEList->a[pExpr->iColumn].pExpr;
      iVar2 = sqlite3ExprIsVector(pEVar3);
      if (iVar2 != 0) {
        sqlite3VectorErrorMsg(pSubst->pParse,pEVar3);
        return pExpr;
      }
      db = pSubst->pParse->db;
      p = pEVar3;
      if ((pSubst->isLeftJoin != 0) && (pEVar3->op != 0xa2)) {
        ifNullRow.u.zToken = (char *)0x0;
        ifNullRow.pRight = (Expr *)0x0;
        ifNullRow.iColumn = 0;
        ifNullRow.iAgg = 0;
        ifNullRow.iRightJoinTable = 0;
        ifNullRow.op2 = '\0';
        ifNullRow._55_1_ = 0;
        ifNullRow.pAggInfo = (AggInfo *)0x0;
        ifNullRow.x.pList = (ExprList *)0x0;
        ifNullRow.y.pTab = (Table *)0x0;
        ifNullRow.op = 0xab;
        ifNullRow.affinity = '\0';
        ifNullRow._2_2_ = 0;
        ifNullRow.flags = 0;
        ifNullRow._40_8_ = (ulong)(uint)pSubst->iNewTable << 0x20;
        p = &ifNullRow;
        ifNullRow.pLeft = pEVar3;
      }
      pEVar3 = sqlite3ExprDup(db,p,0);
      if (pEVar3 != (Expr *)0x0) {
        if (pSubst->isLeftJoin != 0) {
          pbVar1 = (byte *)((long)&pEVar3->flags + 2);
          *pbVar1 = *pbVar1 | 0x10;
        }
        if ((pExpr->flags & 1) != 0) {
          pEVar3->iRightJoinTable = pExpr->iRightJoinTable;
          *(byte *)&pEVar3->flags = (byte)pEVar3->flags | 1;
        }
      }
      sqlite3ExprDeleteNN(db,pExpr);
      return pEVar3;
    }
    pEVar3 = substExpr(pSubst,pExpr->pLeft);
    pExpr->pLeft = pEVar3;
    pEVar3 = substExpr(pSubst,pExpr->pRight);
    pExpr->pRight = pEVar3;
    if ((pExpr->flags & 0x800) == 0) {
      substExprList(pSubst,(pExpr->x).pList);
    }
    else {
      substSelect(pSubst,(Select *)(pExpr->x).pList,1);
    }
  }
  return pExpr;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_FromJoin)
   && pExpr->iRightJoinTable==pSubst->iTable
  ){
    pExpr->iRightJoinTable = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN && pExpr->iTable==pSubst->iTable ){
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else{
      Expr *pNew;
      Expr *pCopy = pSubst->pEList->a[pExpr->iColumn].pExpr;
      Expr ifNullRow;
      assert( pSubst->pEList!=0 && pExpr->iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isLeftJoin && pCopy->op!=TK_COLUMN ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          pCopy = &ifNullRow;
        }
        testcase( ExprHasProperty(pCopy, EP_Subquery) );
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( pNew && pSubst->isLeftJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( pNew && ExprHasProperty(pExpr,EP_FromJoin) ){
          pNew->iRightJoinTable = pExpr->iRightJoinTable;
          ExprSetProperty(pNew, EP_FromJoin);
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
  }
  return pExpr;
}